

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O3

void __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseStringToStream<272u,rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::BasicIStreamWrapper<std::istream>,rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::StackStream<char>>
          (GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_> *is,
          StackStream<char> *os)

{
  byte bVar1;
  char cVar2;
  uint codepoint;
  uint uVar3;
  byte *pbVar4;
  char *pcVar5;
  RapidJSONException *this_00;
  Ch c;
  
  do {
    while( true ) {
      pbVar4 = (byte *)is->current_;
      bVar1 = *pbVar4;
      if (bVar1 != 0x5c) break;
      pbVar4 = pbVar4 + (is->count_ - (long)is->buffer_);
      BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Read(is);
      cVar2 = ""[(byte)*is->current_];
      if (cVar2 == '\0') {
        if (*is->current_ != 0x75) {
          if (*(int *)(this + 0x30) != 0) {
            this_00 = (RapidJSONException *)__cxa_allocate_exception(0x10);
            cereal::RapidJSONException::RapidJSONException
                      (this_00,"rapidjson internal assertion failure: !HasParseError()");
            goto LAB_00152718;
          }
          *(undefined4 *)(this + 0x30) = 10;
          goto LAB_001526cb;
        }
        BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Read(is);
        codepoint = ParseHex4<rapidjson::BasicIStreamWrapper<std::istream>>(this,is,(size_t)pbVar4);
        if (*(int *)(this + 0x30) != 0) {
          return;
        }
        if ((codepoint & 0xfffffc00) == 0xd800) {
          if (*is->current_ == '\\') {
            BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Read(is);
            if (*is->current_ == 'u') {
              BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Read(is);
              uVar3 = ParseHex4<rapidjson::BasicIStreamWrapper<std::istream>>
                                (this,is,(size_t)pbVar4);
              if (*(int *)(this + 0x30) != 0) {
                return;
              }
              if (0xfffffbff < uVar3 - 0xe000) {
                codepoint = codepoint * 0x400 + uVar3 + 0xfca02400;
                goto LAB_0015261f;
              }
            }
            else if (*(int *)(this + 0x30) != 0) {
              this_00 = (RapidJSONException *)__cxa_allocate_exception(0x10);
              cereal::RapidJSONException::RapidJSONException
                        (this_00,"rapidjson internal assertion failure: !HasParseError()");
              goto LAB_00152718;
            }
          }
          *(undefined4 *)(this + 0x30) = 9;
          goto LAB_001526cb;
        }
LAB_0015261f:
        UTF8<char>::
        Encode<rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::StackStream<char>>
                  (os,codepoint);
      }
      else {
        BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Read(is);
        pcVar5 = internal::Stack<rapidjson::CrtAllocator>::Push<char>(os->stack_,1);
        *pcVar5 = cVar2;
        os->length_ = os->length_ + 1;
      }
    }
    if (bVar1 == 0x22) {
      ParseStringToStream<272u,rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::BasicIStreamWrapper<std::istream>,rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::StackStream<char>>
                ();
      return;
    }
    if (bVar1 < 0x20) break;
    BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Read(is);
    pbVar4 = (byte *)internal::Stack<rapidjson::CrtAllocator>::Push<char>(os->stack_,1);
    *pbVar4 = bVar1;
    os->length_ = os->length_ + 1;
  } while( true );
  if (bVar1 == 0) {
    if (*(int *)(this + 0x30) != 0) {
      this_00 = (RapidJSONException *)__cxa_allocate_exception(0x10);
      cereal::RapidJSONException::RapidJSONException
                (this_00,"rapidjson internal assertion failure: !HasParseError()");
      goto LAB_00152718;
    }
    pbVar4 = pbVar4 + (is->count_ - (long)is->buffer_);
    *(undefined4 *)(this + 0x30) = 0xb;
  }
  else {
    if (*(int *)(this + 0x30) != 0) {
      this_00 = (RapidJSONException *)__cxa_allocate_exception(0x10);
      cereal::RapidJSONException::RapidJSONException
                (this_00,"rapidjson internal assertion failure: !HasParseError()");
LAB_00152718:
      __cxa_throw(this_00,&cereal::RapidJSONException::typeinfo,std::runtime_error::~runtime_error);
    }
    pbVar4 = pbVar4 + (is->count_ - (long)is->buffer_);
    *(undefined4 *)(this + 0x30) = 0xc;
  }
LAB_001526cb:
  *(byte **)(this + 0x38) = pbVar4;
  return;
}

Assistant:

CEREAL_RAPIDJSON_FORCEINLINE void ParseStringToStream(InputStream& is, OutputStream& os) {
//!@cond CEREAL_RAPIDJSON_HIDDEN_FROM_DOXYGEN
#define Z16 0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0
        static const char escape[256] = {
            Z16, Z16, 0, 0,'\"', 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0,'/',
            Z16, Z16, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0,'\\', 0, 0, 0,
            0, 0,'\b', 0, 0, 0,'\f', 0, 0, 0, 0, 0, 0, 0,'\n', 0,
            0, 0,'\r', 0,'\t', 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0,
            Z16, Z16, Z16, Z16, Z16, Z16, Z16, Z16
        };
#undef Z16
//!@endcond

        for (;;) {
            // Scan and copy string before "\\\"" or < 0x20. This is an optional optimzation.
            if (!(parseFlags & kParseValidateEncodingFlag))
                ScanCopyUnescapedString(is, os);

            Ch c = is.Peek();
            if (CEREAL_RAPIDJSON_UNLIKELY(c == '\\')) {    // Escape
                size_t escapeOffset = is.Tell();    // For invalid escaping, report the initial '\\' as error offset
                is.Take();
                Ch e = is.Peek();
                if ((sizeof(Ch) == 1 || unsigned(e) < 256) && CEREAL_RAPIDJSON_LIKELY(escape[static_cast<unsigned char>(e)])) {
                    is.Take();
                    os.Put(static_cast<typename TEncoding::Ch>(escape[static_cast<unsigned char>(e)]));
                }
                else if (CEREAL_RAPIDJSON_LIKELY(e == 'u')) {    // Unicode
                    is.Take();
                    unsigned codepoint = ParseHex4(is, escapeOffset);
                    CEREAL_RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;
                    if (CEREAL_RAPIDJSON_UNLIKELY(codepoint >= 0xD800 && codepoint <= 0xDBFF)) {
                        // Handle UTF-16 surrogate pair
                        if (CEREAL_RAPIDJSON_UNLIKELY(!Consume(is, '\\') || !Consume(is, 'u')))
                            CEREAL_RAPIDJSON_PARSE_ERROR(kParseErrorStringUnicodeSurrogateInvalid, escapeOffset);
                        unsigned codepoint2 = ParseHex4(is, escapeOffset);
                        CEREAL_RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;
                        if (CEREAL_RAPIDJSON_UNLIKELY(codepoint2 < 0xDC00 || codepoint2 > 0xDFFF))
                            CEREAL_RAPIDJSON_PARSE_ERROR(kParseErrorStringUnicodeSurrogateInvalid, escapeOffset);
                        codepoint = (((codepoint - 0xD800) << 10) | (codepoint2 - 0xDC00)) + 0x10000;
                    }
                    TEncoding::Encode(os, codepoint);
                }
                else
                    CEREAL_RAPIDJSON_PARSE_ERROR(kParseErrorStringEscapeInvalid, escapeOffset);
            }
            else if (CEREAL_RAPIDJSON_UNLIKELY(c == '"')) {    // Closing double quote
                is.Take();
                os.Put('\0');   // null-terminate the string
                return;
            }
            else if (CEREAL_RAPIDJSON_UNLIKELY(static_cast<unsigned>(c) < 0x20)) { // RFC 4627: unescaped = %x20-21 / %x23-5B / %x5D-10FFFF
                if (c == '\0')
                    CEREAL_RAPIDJSON_PARSE_ERROR(kParseErrorStringMissQuotationMark, is.Tell());
                else
                    CEREAL_RAPIDJSON_PARSE_ERROR(kParseErrorStringInvalidEncoding, is.Tell());
            }
            else {
                size_t offset = is.Tell();
                if (CEREAL_RAPIDJSON_UNLIKELY((parseFlags & kParseValidateEncodingFlag ?
                    !Transcoder<SEncoding, TEncoding>::Validate(is, os) :
                    !Transcoder<SEncoding, TEncoding>::Transcode(is, os))))
                    CEREAL_RAPIDJSON_PARSE_ERROR(kParseErrorStringInvalidEncoding, offset);
            }
        }
    }